

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

RDL_cycleIterator *
RDL_initCycleIterator
          (RDL_IteratorType itype,uint rcf_index,uint rcf_index_max,uint urf_index,
          uint urf_index_max,uint bcc_index,uint bcc_index_max,char mode,RDL_data *data)

{
  RDL_URFinfo *pRVar1;
  RDL_cycleIterator *it_00;
  RDL_cycleIterator *pRVar2;
  RDL_URFinfo *uInfo;
  RDL_cycleIterator *it;
  uint local_30;
  uint number;
  uint j;
  uint i;
  uint bcc_index_local;
  uint urf_index_max_local;
  uint urf_index_local;
  uint rcf_index_max_local;
  uint rcf_index_local;
  RDL_IteratorType itype_local;
  
  it_00 = (RDL_cycleIterator *)malloc(0x50);
  it_00->mode = mode;
  it_00->it1 = (RDL_pathIterator *)0x0;
  it_00->it2 = (RDL_pathIterator *)0x0;
  it_00->end = '\0';
  it_00->data = data;
  it_00->compressed_cycle = (uchar *)0x0;
  if (it_00->data->bccGraphs->nof_bcc == 0) {
    it_00->end = '\x01';
  }
  else {
    if (it_00->mode == 'a') {
      it._4_4_ = it_00->data->bccGraphs->bcc_graphs[bcc_index]->V;
    }
    else {
      it._4_4_ = it_00->data->bccGraphs->bcc_graphs[bcc_index]->E;
    }
    RDL_bitset_init(&it_00->compressed_cycle,it._4_4_);
    it_00->bcc_index = bcc_index;
    it_00->bcc_index_max = bcc_index_max;
    pRVar1 = data->urfInfoPerBCC[bcc_index];
    if ((itype == RDL_URF_IT) || (itype == RDL_RCF_IT)) {
      it_00->urf_index = urf_index;
      it_00->urf_index_max = urf_index_max;
    }
    else {
      it_00->urf_index = 0;
      it_00->urf_index_max = data->nofURFsPerBCC[it_00->bcc_index] - 1;
    }
    if (itype == RDL_RCF_IT) {
      it_00->rcf_index = rcf_index;
      it_00->rcf_index_max = rcf_index_max;
    }
    else {
      it_00->rcf_index = 0;
      it_00->rcf_index_max = pRVar1->nofCFsPerURF[it_00->urf_index] - 1;
    }
    it_00->type = itype;
    it_00->running_rcf = 0;
    it_00->running_urf = 0;
    for (number = 0; number < bcc_index; number = number + 1) {
      for (local_30 = 0; local_30 < data->nofURFsPerBCC[number]; local_30 = local_30 + 1) {
        it_00->running_rcf =
             data->urfInfoPerBCC[number]->nofCFsPerURF[local_30] + it_00->running_rcf;
      }
      it_00->running_urf = data->nofURFsPerBCC[number] + it_00->running_urf;
    }
    it_00->running_urf = urf_index + it_00->running_urf;
    for (number = 0; number < urf_index; number = number + 1) {
      it_00->running_rcf = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[number] + it_00->running_rcf
      ;
    }
    it_00->running_rcf = rcf_index + it_00->running_rcf;
    pRVar2 = RDL_cycleIteratorNext(it_00);
    if (pRVar2 == (RDL_cycleIterator *)0x0) {
      (*RDL_outputFunc)(RDL_ERROR,"Iterator initialization failed!\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                    ,0x28a,
                    "RDL_cycleIterator *RDL_initCycleIterator(RDL_IteratorType, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, char, const RDL_data *)"
                   );
    }
  }
  return it_00;
}

Assistant:

RDL_cycleIterator* RDL_initCycleIterator(
    RDL_IteratorType itype,
    unsigned rcf_index,
    unsigned rcf_index_max,
    unsigned urf_index,
    unsigned urf_index_max,
    unsigned bcc_index,
    unsigned bcc_index_max,
    char mode,
    const RDL_data* data)
{
  unsigned i, j, number;
  RDL_cycleIterator *it;
  const RDL_URFinfo *uInfo;

  it = malloc(sizeof(*it));

  it->mode = mode;
  it->it1 = NULL;
  it->it2 = NULL;
  it->end = 0;
  it->data = data;
  it->compressed_cycle = NULL;

  /* stop right here, if there is nothing to iterate */
  if (it->data->bccGraphs->nof_bcc == 0) {
    it->end = 1;
    return it;
  }
  if (it->mode == 'a') {
    number = it->data->bccGraphs->bcc_graphs[bcc_index]->V;
  }
  else {
    number = it->data->bccGraphs->bcc_graphs[bcc_index]->E;
  }
  RDL_bitset_init(&it->compressed_cycle, number);

  it->bcc_index = bcc_index;
  it->bcc_index_max = bcc_index_max;

  uInfo = data->urfInfoPerBCC[bcc_index];

  if (itype == RDL_URF_IT || itype == RDL_RCF_IT) {
    it->urf_index = urf_index;
    it->urf_index_max = urf_index_max;
  }
  else {
    it->urf_index = 0;
    it->urf_index_max = data->nofURFsPerBCC[it->bcc_index] - 1;
  }

  if (itype == RDL_RCF_IT) {
    it->rcf_index = rcf_index;
    it->rcf_index_max = rcf_index_max;
  }
  else {
    it->rcf_index = 0;
    it->rcf_index_max = uInfo->nofCFsPerURF[it->urf_index] - 1;
  }

  it->type = itype;
  it->running_rcf = 0;
  it->running_urf = 0;

  for(i = 0; i < bcc_index; ++i) {
    for(j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      it->running_rcf += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
    it->running_urf += data->nofURFsPerBCC[i];
  }
  it->running_urf += urf_index;

  for(i = 0; i < urf_index; ++i) {
    it->running_rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i];
  }
  it->running_rcf += rcf_index;

  if (!RDL_cycleIteratorNext(it)) {
    RDL_outputFunc(RDL_ERROR, "Iterator initialization failed!\n");
    assert(0);
    return NULL;
  }

  return it;
}